

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O1

_Bool IsRenderTextureValid(RenderTexture2D target)

{
  bool bVar1;
  bool bVar2;
  
  if (target.id != 0) {
    bVar1 = false;
    bVar2 = false;
    if ((((target.depth.id != 0) && (bVar2 = bVar1, 0 < target.depth.width)) &&
        (0 < target.depth.height)) && ((0 < target.depth.format && (0 < target.depth.mipmaps)))) {
      bVar2 = 0 < target.texture.mipmaps &&
              ((0 < target.texture.format && target.texture.id != 0) &&
              (0 < target.texture.height && 0 < target.texture.width));
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool IsRenderTextureValid(RenderTexture2D target)
{
    bool result = false;

    if ((target.id > 0) &&                  // Validate OpenGL id (loaded on GPU)
        IsTextureValid(target.depth) &&     // Validate FBO depth texture/renderbuffer attachment
        IsTextureValid(target.texture)) result = true; // Validate FBO texture attachment

    return result;
}